

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_test.c
# Opt level: O3

bool_t zzTest(void)

{
  word *pwVar1;
  word *pwVar2;
  word *state;
  u32 uVar3;
  bool_t bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  word wVar9;
  word wVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  u64 uVar19;
  ulong n;
  ulong m;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  word b_1 [8];
  word r [8];
  octet combo_state [32];
  word b [8];
  word c [8];
  word c1 [8];
  octet combo_state_1 [32];
  word r1 [8];
  word a [8];
  size_t local_b50;
  size_t local_b48;
  long local_b40;
  word local_b38;
  word local_b30;
  undefined8 local_b28;
  word awStack_b08 [2];
  ulong local_af8 [8];
  word local_ab8 [9];
  word awStack_a70 [26];
  size_t local_9a0;
  word local_998;
  word local_990 [14];
  long lStack_920;
  uint local_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined8 local_908;
  word local_8d8 [8];
  undefined1 local_898 [32];
  word local_878 [8];
  word local_838 [257];
  
  sVar8 = prngCOMBO_keep();
  if (0x20 < sVar8) {
    return 0;
  }
  uVar3 = utilNonce32();
  prngCOMBOStart(awStack_b08 + 10,uVar3);
  lVar21 = -0x1f5;
  while (lVar21 = lVar21 + 1, lVar21 != 0) {
    prngCOMBOStepR(local_838,0x40,awStack_b08 + 10);
    pwVar1 = awStack_a70 + 1;
    prngCOMBOStepR(pwVar1,0x40,awStack_b08 + 10);
    wVar9 = zzAdd(&local_998,local_838,pwVar1,8);
    wVar10 = zzSub((word *)&local_918,&local_998,pwVar1,8);
    if (wVar10 != wVar9) {
      return 0;
    }
    bVar4 = wwEq((word *)&local_918,local_838,8);
    if (bVar4 == 0) {
      return 0;
    }
    uVar5 = zzIsSumEq(&local_998,local_838,awStack_a70 + 1,8);
    if (uVar5 != (wVar9 == 0)) {
      return 0;
    }
    uVar6 = zzIsSumEq_fast(&local_998,local_838,awStack_a70 + 1,8);
    if (uVar6 != uVar5) {
      return 0;
    }
    wwCopy((word *)&local_918,local_838,8);
    wVar10 = zzAdd2((word *)&local_918,awStack_a70 + 1,8);
    if (wVar10 != wVar9) {
      return 0;
    }
    bVar4 = wwEq((word *)&local_918,&local_998,8);
    if (bVar4 == 0) {
      return 0;
    }
    wVar10 = zzSub2((word *)&local_918,awStack_a70 + 1,8);
    if (wVar10 != wVar9) {
      return 0;
    }
    bVar4 = wwEq((word *)&local_918,local_838,8);
    if (bVar4 == 0) {
      return 0;
    }
    wVar9 = zzAddW(&local_998,local_838,8,awStack_a70[1]);
    wVar10 = zzSubW((word *)&local_918,&local_998,8,awStack_a70[1]);
    if (wVar10 != wVar9) {
      return 0;
    }
    bVar4 = wwEq((word *)&local_918,local_838,8);
    if (bVar4 == 0) {
      return 0;
    }
    uVar5 = zzIsSumWEq(&local_998,local_838,8,awStack_a70[1]);
    if (uVar5 != (wVar9 == 0)) {
      return 0;
    }
    uVar6 = zzIsSumWEq_fast(&local_998,local_838,8,awStack_a70[1]);
    if (uVar6 != uVar5) {
      return 0;
    }
    wwCopy((word *)&local_918,local_838,8);
    wVar10 = zzAddW2((word *)&local_918,8,awStack_a70[1]);
    if (wVar10 != wVar9) {
      return 0;
    }
    bVar4 = wwEq((word *)&local_918,&local_998,8);
    if (bVar4 == 0) {
      return 0;
    }
    wVar10 = zzSubW2((word *)&local_918,8,awStack_a70[1]);
    if (wVar10 != wVar9) {
      return 0;
    }
    bVar4 = wwEq((word *)&local_918,local_838,8);
    if (bVar4 == 0) {
      return 0;
    }
    wVar9 = zzAddW(&local_998,local_838,1,awStack_a70[1]);
    wVar10 = zzSubW((word *)&local_918,&local_998,1,awStack_a70[1]);
    if (wVar10 != wVar9) {
      return 0;
    }
    bVar4 = wwEq((word *)&local_918,local_838,1);
    if (bVar4 == 0) {
      return 0;
    }
    uVar5 = zzIsSumWEq(&local_998,local_838,1,awStack_a70[1]);
    if (uVar5 != (wVar9 == 0)) {
      return 0;
    }
    uVar6 = zzIsSumWEq_fast(&local_998,local_838,1,awStack_a70[1]);
    if (uVar6 != uVar5) {
      return 0;
    }
    wVar9 = zzAdd(&local_998,local_838,awStack_a70 + 1,8);
    wVar10 = zzAdd3((word *)&local_918,local_838,8,awStack_a70 + 1,8);
    if (wVar10 != wVar9) {
      return 0;
    }
    bVar4 = wwEq((word *)&local_918,&local_998,8);
    if (bVar4 == 0) {
      return 0;
    }
    awStack_a70[8] = 0;
    wVar9 = zzAdd(&local_998,local_838,awStack_a70 + 1,8);
    wVar10 = zzAdd3((word *)&local_918,local_838,8,awStack_a70 + 1,7);
    if (wVar10 != wVar9) {
      return 0;
    }
    bVar4 = wwEq((word *)&local_918,&local_998,8);
    if (bVar4 == 0) {
      return 0;
    }
    wVar10 = zzAdd3((word *)&local_918,awStack_a70 + 1,7,local_838,8);
    if (wVar10 != wVar9) {
      return 0;
    }
    bVar4 = wwEq((word *)&local_918,&local_998,8);
    if (bVar4 == 0) {
      return 0;
    }
    zzNeg(awStack_a70 + 1,local_838,8);
    wVar9 = zzAdd(&local_998,local_838,awStack_a70 + 1,8);
    if (wVar9 != 1) {
      return 0;
    }
    bVar4 = wwIsZero(&local_998,8);
    if (bVar4 == 0) {
      return 0;
    }
  }
  sVar8 = prngCOMBO_keep();
  if (0x20 < sVar8) {
    return 0;
  }
  sVar8 = zzMul_deep(8,8);
  sVar11 = zzSqr_deep(8);
  sVar12 = zzDiv_deep(0x10,8);
  sVar13 = zzMod_deep(0x10,8);
  sVar8 = utilMax(4,sVar8,sVar11,sVar12,sVar13);
  if (0x800 < sVar8) {
    return 0;
  }
  uVar3 = utilNonce32();
  prngCOMBOStart(local_898,uVar3);
  local_b40 = 499;
  do {
    prngCOMBOStepR(awStack_b08 + 10,0x40,local_898);
    prngCOMBOStepR(&local_b38,0x40,local_898);
    sVar8 = 1;
    sVar11 = 2;
    do {
      pwVar1 = awStack_b08 + 10;
      zzSqr(awStack_a70 + 1,pwVar1,sVar8,local_838);
      zzMul(&local_998,pwVar1,sVar8,pwVar1,sVar8,local_838);
      bVar4 = wwEq(awStack_a70 + 1,&local_998,sVar11);
      if (bVar4 == 0) {
        return 0;
      }
      sVar8 = sVar8 + 1;
      sVar11 = sVar11 + 2;
    } while (sVar8 != 9);
    sVar8 = 1;
    local_b50 = 0;
    do {
      awStack_b08[sVar8 + 9] = awStack_b08[sVar8 + 9] + (ulong)(awStack_b08[sVar8 + 9] == 0);
      zzRandMod(awStack_b08 + 2,awStack_b08 + 10,sVar8,prngCOMBOStepR,local_898);
      lVar21 = 2;
      do {
        sVar11 = lVar21 - 1;
        pwVar1 = awStack_a70 + 1;
        zzMul(pwVar1,awStack_b08 + 10,sVar8,&local_b38,sVar11,local_838);
        wVar9 = zzAdd2(pwVar1,awStack_b08 + 2,sVar8);
        zzAddW2(awStack_a70 + sVar8 + 1,sVar11,wVar9);
        zzMod(local_878,pwVar1,local_b50 + lVar21,awStack_b08 + 10,sVar8,local_838);
        bVar4 = wwEq(awStack_b08 + 2,local_878,sVar8);
        if (bVar4 == 0) {
          return 0;
        }
        zzDiv((word *)&local_918,local_878,awStack_a70 + 1,local_b50 + lVar21,awStack_b08 + 10,sVar8
              ,local_838);
        bVar4 = wwEq(awStack_b08 + 2,local_878,sVar8);
        if (bVar4 == 0) {
          return 0;
        }
        bVar4 = wwEq(&local_b38,(word *)&local_918,sVar11);
        if (bVar4 == 0) {
          return 0;
        }
        if ((&lStack_920)[lVar21] != 0) {
          return 0;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 10);
      sVar8 = sVar8 + 1;
      local_b50 = local_b50 + 1;
    } while (sVar8 != 9);
    sVar8 = 1;
    do {
      wVar9 = awStack_b08[sVar8 + 1];
      wwCopy(awStack_a70 + 1,awStack_b08 + 10,sVar8);
      wVar10 = zzAddMulW(awStack_a70 + 1,&local_b38,sVar8,wVar9);
      wVar9 = zzSubMulW(awStack_a70 + 1,&local_b38,sVar8,wVar9);
      if (wVar10 != wVar9) {
        return 0;
      }
      bVar4 = wwEq(awStack_a70 + 1,awStack_b08 + 10,sVar8);
      if (bVar4 == 0) {
        return 0;
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != 9);
    local_b50 = 1;
    lVar21 = 2;
    while (lVar21 != 10) {
      uVar20 = awStack_b08[lVar21] + (ulong)(awStack_b08[lVar21] == 0);
      pwVar1 = awStack_b08 + 10;
      wVar9 = zzMulW(awStack_a70 + 1,pwVar1,local_b50,uVar20);
      awStack_a70[lVar21] = wVar9;
      sVar8 = local_b50 + 1;
      zzDivW(&local_998,awStack_a70 + 1,sVar8,uVar20);
      bVar4 = wwEq(&local_998,pwVar1,local_b50);
      if (bVar4 == 0) {
        return 0;
      }
      if ((&local_9a0)[lVar21] != 0) {
        return 0;
      }
      local_af8[0] = local_af8[0] % uVar20;
      pwVar2 = awStack_a70 + 1;
      wVar9 = zzAddW(pwVar2,pwVar2,sVar8,local_af8[0]);
      awStack_a70[lVar21 + 1] = wVar9;
      wVar9 = zzModW(pwVar2,local_b50 + 2,uVar20);
      if (wVar9 != local_af8[0]) {
        return 0;
      }
      wVar9 = uVar20 & 0xffffffff;
      if (wVar9 == 0) {
        wVar9 = 0x100000000;
      }
      local_af8[1] = local_af8[1] % wVar9;
      pwVar2 = awStack_a70 + 1;
      wVar10 = zzMulW(pwVar2,pwVar1,local_b50,wVar9);
      awStack_a70[lVar21] = wVar10;
      wVar10 = zzAddW(pwVar2,pwVar2,sVar8,local_af8[1]);
      awStack_a70[lVar21 + 1] = wVar10;
      wVar9 = zzModW2(pwVar2,local_b50 + 2,wVar9);
      lVar21 = lVar21 + 1;
      local_b50 = sVar8;
      if (wVar9 != local_af8[1]) {
        return 0;
      }
    }
    bVar22 = local_b40 != 0;
    local_b40 = local_b40 + -1;
  } while (bVar22);
  local_918 = 0xffffffff;
  uStack_914 = 0xffffffff;
  uStack_910 = 0xffffffff;
  uStack_90c = 0xffffffff;
  local_b38 = 0xffffffffffffffff;
  local_b30 = 0x8000000000000000;
  zzMul(awStack_b08 + 10,&local_b38,2,(word *)&local_918,2,local_838);
  zzDiv(&local_998,awStack_b08 + 2,awStack_b08 + 10,4,&local_b38,2,local_838);
  bVar4 = wwIsZero(awStack_b08 + 2,2);
  if (bVar4 == 0) {
    return 0;
  }
  bVar4 = wwEq(&local_998,(word *)&local_918,2);
  if (bVar4 == 0) {
    return 0;
  }
  if (local_990[1] != 0) {
    return 0;
  }
  local_908 = 0xffffffffffffffff;
  local_918 = 0xffffffff;
  uStack_914 = 0xffffffff;
  uStack_910 = 0xffffffff;
  uStack_90c = 0xffffffff;
  local_b38 = 0xffffffffffffffff;
  local_b30 = 0;
  local_b28 = 0x8000000000000000;
  zzMul(awStack_b08 + 10,&local_b38,3,(word *)&local_918,3,local_838);
  zzDiv(&local_998,awStack_b08 + 2,awStack_b08 + 10,6,&local_b38,3,local_838);
  bVar4 = wwIsZero(awStack_b08 + 2,2);
  if (bVar4 == 0) {
    return 0;
  }
  bVar4 = wwEq(&local_998,(word *)&local_918,3);
  if (bVar4 == 0) {
    return 0;
  }
  if (local_990[2] != 0) {
    return 0;
  }
  sVar8 = prngCOMBO_keep();
  if (0x20 < sVar8) {
    return 0;
  }
  sVar8 = zzPowerMod_deep(8,1);
  sVar11 = zzMulMod_deep(8);
  sVar12 = zzSqrMod_deep(8);
  local_9a0 = zzMod_deep(8,8);
  sVar13 = zzJacobi_deep(8,8);
  sVar14 = zzGCD_deep(8,8);
  sVar15 = zzIsCoprime_deep(8,8);
  sVar16 = zzDivMod_deep(8);
  sVar17 = zzInvMod_deep(8);
  sVar18 = zzAlmostInvMod_deep(8);
  sVar8 = utilMax(10,sVar8,sVar11,sVar12,local_9a0,sVar13,sVar14,sVar15,sVar16,sVar17,sVar18);
  if (0x800 < sVar8) {
    return 0;
  }
  uVar3 = utilNonce32();
  prngCOMBOStart(awStack_b08 + 2,uVar3);
  wwRepW(&local_b38,8,0xffffffffffffffff);
  bVar4 = zzIsOdd(&local_b38,8);
  if (bVar4 == 0) {
    return 0;
  }
  bVar4 = zzIsEven(&local_b38,8);
  if (bVar4 != 0) {
    return 0;
  }
  bVar4 = zzRandMod(awStack_a70 + 1,&local_b38,8,prngCOMBOStepR,awStack_b08 + 2);
  if (bVar4 == 0) {
    return 0;
  }
  local_998 = 3;
  pwVar1 = awStack_a70 + 1;
  zzPowerMod((word *)&local_918,pwVar1,8,&local_998,1,&local_b38,local_838);
  pwVar2 = awStack_b08 + 10;
  zzSqrMod(pwVar2,pwVar1,&local_b38,8,local_838);
  zzMulMod(pwVar2,pwVar2,pwVar1,&local_b38,8,local_838);
  iVar7 = wwCmp((word *)&local_918,pwVar2,8);
  if (iVar7 != 0) {
    return 0;
  }
  local_b50 = 499;
  pwVar1 = awStack_a70 + 1;
  pwVar2 = awStack_b08 + 10;
  do {
    state = awStack_b08 + 2;
    prngCOMBOStepR(&local_b38,0x40,state);
    prngCOMBOStepR(pwVar1,0x40,state);
    prngCOMBOStepR(&local_998,0x40,state);
    if (awStack_b08[1] == 0) {
      awStack_b08[1] = -1;
    }
    zzMod(pwVar1,pwVar1,8,&local_b38,8,local_838);
    zzMod(&local_998,&local_998,8,&local_b38,8,local_838);
    zzAddMod((word *)&local_918,pwVar1,&local_998,&local_b38,8);
    zzSubMod(pwVar2,(word *)&local_918,&local_998,&local_b38,8);
    bVar4 = wwEq(pwVar2,pwVar1,8);
    if (bVar4 == 0) {
      return 0;
    }
    zzSubMod(pwVar2,(word *)&local_918,pwVar1,&local_b38,8);
    bVar4 = wwEq(pwVar2,&local_998,8);
    if (bVar4 == 0) {
      return 0;
    }
    zzAddMod_fast((word *)&local_918,pwVar1,&local_998,&local_b38,8);
    zzSubMod_fast(pwVar2,(word *)&local_918,&local_998,&local_b38,8);
    bVar4 = wwEq_fast(pwVar2,pwVar1,8);
    if (bVar4 == 0) {
      return 0;
    }
    zzSubMod_fast(pwVar2,(word *)&local_918,pwVar1,&local_b38,8);
    bVar4 = wwEq_fast(pwVar2,&local_998,8);
    if (bVar4 == 0) {
      return 0;
    }
    zzAddWMod((word *)&local_918,pwVar1,local_998,&local_b38,8);
    zzSubWMod(pwVar2,(word *)&local_918,local_998,&local_b38,8);
    bVar4 = wwEq(pwVar2,pwVar1,8);
    if (bVar4 == 0) {
      return 0;
    }
    zzAddWMod_fast((word *)&local_918,pwVar1,local_998,&local_b38,8);
    zzSubWMod_fast(pwVar2,(word *)&local_918,local_998,&local_b38,8);
    bVar4 = wwEq_fast(pwVar2,pwVar1,8);
    if (bVar4 == 0) {
      return 0;
    }
    zzNegMod((word *)&local_918,pwVar1,&local_b38,8);
    zzAddMod(pwVar2,(word *)&local_918,pwVar1,&local_b38,8);
    bVar4 = wwIsZero(pwVar2,8);
    if (bVar4 == 0) {
      return 0;
    }
    zzNegMod(pwVar2,pwVar2,&local_b38,8);
    bVar4 = wwIsZero(pwVar2,8);
    if (bVar4 == 0) {
      return 0;
    }
    zzNegMod_fast((word *)&local_918,pwVar1,&local_b38,8);
    zzAddMod_fast(pwVar2,(word *)&local_918,pwVar1,&local_b38,8);
    bVar4 = wwIsZero_fast(pwVar2,8);
    if (bVar4 == 0) {
      return 0;
    }
    zzNegMod_fast(pwVar2,pwVar2,&local_b38,8);
    bVar4 = wwIsZero_fast(pwVar2,8);
    if (bVar4 == 0) {
      return 0;
    }
    local_b38 = local_b38 | 1;
    zzHalfMod((word *)&local_918,pwVar1,&local_b38,8);
    zzDoubleMod(pwVar2,(word *)&local_918,&local_b38,8);
    bVar4 = wwEq(pwVar2,pwVar1,8);
    if (bVar4 == 0) {
      return 0;
    }
    zzHalfMod_fast((word *)&local_918,pwVar1,&local_b38,8);
    zzDoubleMod_fast(pwVar2,(word *)&local_918,&local_b38,8);
    bVar4 = wwEq_fast(pwVar2,pwVar1,8);
    if (bVar4 == 0) {
      return 0;
    }
    zzMulMod((word *)&local_918,pwVar1,pwVar1,&local_b38,8,local_838);
    zzSqrMod(pwVar2,pwVar1,&local_b38,8,local_838);
    bVar4 = wwEq((word *)&local_918,pwVar2,8);
    if (bVar4 == 0) {
      return 0;
    }
    iVar7 = zzJacobi(pwVar2,8,&local_b38,8,local_838);
    if (iVar7 == -1) {
      return 0;
    }
    zzGCD((word *)&local_918,pwVar1,8,&local_b38,8,local_838);
    iVar7 = wwCmpW((word *)&local_918,8,1);
    if (iVar7 == 0) {
      bVar4 = zzIsCoprime(pwVar1,8,&local_b38,8,local_838);
      if (bVar4 == 0) {
        return 0;
      }
      zzInvMod((word *)&local_918,pwVar1,&local_b38,8,local_838);
      zzMulMod((word *)&local_918,(word *)&local_918,&local_998,&local_b38,8,local_838);
      zzDivMod(pwVar2,&local_998,pwVar1,&local_b38,8,local_838);
      bVar4 = wwEq((word *)&local_918,pwVar2,8);
      if (bVar4 == 0) {
        return 0;
      }
      zzMulMod(pwVar2,pwVar2,pwVar1,&local_b38,8,local_838);
      bVar4 = wwEq(pwVar2,&local_998,8);
      if (bVar4 == 0) {
        return 0;
      }
      wwSetZero(local_990,7);
      zzMulWMod((word *)&local_918,pwVar1,local_998,&local_b38,8,local_838);
      zzMulMod(pwVar2,pwVar1,&local_998,&local_b38,8,local_838);
      bVar4 = wwEq((word *)&local_918,pwVar2,8);
      if (bVar4 == 0) {
        return 0;
      }
      for (sVar8 = zzAlmostInvMod((word *)&local_918,pwVar1,&local_b38,8,local_838); sVar8 != 0;
          sVar8 = sVar8 - 1) {
        zzHalfMod((word *)&local_918,(word *)&local_918,&local_b38,8);
      }
      zzInvMod(pwVar2,pwVar1,&local_b38,8,local_838);
      bVar4 = wwEq((word *)&local_918,pwVar2,8);
      if (bVar4 == 0) {
        return 0;
      }
    }
    bVar22 = local_b50 != 0;
    local_b50 = local_b50 + -1;
  } while (bVar22);
  sVar8 = prngCOMBO_keep();
  if (0x20 < sVar8) {
    return 0;
  }
  sVar8 = zzMul_deep(8,8);
  sVar11 = zzGCD_deep(8,8);
  sVar12 = zzLCM_deep(8,8);
  sVar13 = zzExGCD_deep(8,8);
  sVar8 = utilMax(4,sVar8,sVar11,sVar12,sVar13);
  if (0x800 < sVar8) {
    return 0;
  }
  uVar3 = utilNonce32();
  prngCOMBOStart(local_878,uVar3);
  local_b40 = 99;
  do {
    prngCOMBOStepR(awStack_b08 + 10,0x40,local_878);
    prngCOMBOStepR(&local_b38,0x40,local_878);
    local_ab8[0] = local_ab8[0] + (local_ab8[0] == 0);
    local_b48 = 2;
    if (local_b38 == 0) {
      local_b38 = 2;
    }
    uVar20 = 1;
    do {
      local_b50 = 7;
      m = 1;
      sVar8 = local_b48;
      do {
        n = m;
        if (uVar20 < m) {
          n = uVar20;
        }
        pwVar1 = awStack_b08 + 10;
        zzGCD(awStack_b08 + 2,pwVar1,uVar20,&local_b38,m,local_838);
        zzLCM(&local_998,pwVar1,uVar20,&local_b38,m,local_838);
        zzMul((word *)&local_918,pwVar1,uVar20,&local_b38,m,local_838);
        zzMul(awStack_a70 + 1,awStack_b08 + 2,n,&local_998,sVar8,local_838);
        iVar7 = wwCmp2((word *)&local_918,sVar8,awStack_a70 + 1,n + sVar8);
        if (iVar7 != 0) {
          return 0;
        }
        zzExGCD(awStack_b08 + 2,&local_998,local_990 + 7,awStack_b08 + 10,uVar20,&local_b38,m,
                local_838);
        zzMul((word *)&local_918,&local_998,m,awStack_b08 + 10,uVar20,local_838);
        zzMul(awStack_a70 + 1,local_990 + 7,uVar20,&local_b38,m,local_838);
        zzSub2((word *)&local_918,awStack_a70 + 1,sVar8);
        iVar7 = wwCmp2((word *)&local_918,sVar8,awStack_b08 + 2,n);
        if (iVar7 != 0) {
          return 0;
        }
        m = m + 1;
        sVar8 = sVar8 + 1;
        local_b50 = local_b50 + -1;
      } while (local_b50 != 0);
      uVar20 = uVar20 + 1;
      local_b48 = local_b48 + 1;
    } while (uVar20 != 8);
    bVar22 = local_b40 != 0;
    local_b40 = local_b40 + -1;
  } while (bVar22);
  sVar8 = prngCOMBO_keep();
  if (0x20 < sVar8) {
    return 0;
  }
  sVar8 = zzRed_deep(8);
  sVar11 = zzRedCrand_deep(8);
  sVar12 = zzRedBarrStart_deep(8);
  sVar13 = zzRedBarr_deep(8);
  sVar14 = zzRedMont_deep(8);
  sVar15 = zzRedCrandMont_deep(8);
  sVar8 = utilMax(6,sVar8,sVar11,sVar12,sVar13,sVar14,sVar15);
  if (0x800 < sVar8) {
    return 0;
  }
  uVar3 = utilNonce32();
  prngCOMBOStart(awStack_b08 + 2,uVar3);
  local_b50 = -0x1f5;
  while( true ) {
    local_b50 = local_b50 + 1;
    if (local_b50 == 0) {
      sVar8 = prngCOMBO_keep();
      if (0x20 < sVar8) {
        return 0;
      }
      sVar8 = zzSqr_deep(8);
      sVar11 = zzSqrt_deep(8);
      sVar12 = zzJacobi_deep(0x10,8);
      sVar8 = utilMax(3,sVar8,sVar11,sVar12);
      if (0x800 < sVar8) {
        return 0;
      }
      uVar3 = utilNonce32();
      pwVar1 = awStack_b08 + 10;
      prngCOMBOStart(pwVar1,uVar3);
      lVar21 = -0x1f5;
      while (lVar21 = lVar21 + 1, lVar21 != 0) {
        prngCOMBOStepR(&local_998,0x40,pwVar1);
        zzSqr(awStack_a70 + 1,&local_998,8,local_838);
        prngCOMBOStepR(&local_918,0x40,pwVar1);
        local_918 = local_918 | 1;
        iVar7 = zzJacobi(awStack_a70 + 1,0x10,(word *)&local_918,8,local_838);
        if (iVar7 == -1) {
          return 0;
        }
      }
      lVar21 = -500;
      pwVar1 = awStack_a70 + 1;
      do {
        prngCOMBOStepR(&local_998,0x40,awStack_b08 + 10);
        zzSqr(pwVar1,&local_998,8,local_838);
        zzSqrt((word *)&local_918,pwVar1,0x10,local_838);
        bVar4 = wwEq(&local_998,(word *)&local_918,8);
        if (bVar4 == 0) {
          return 0;
        }
        zzAddW2(pwVar1,0x10,1);
        zzSqrt((word *)&local_918,pwVar1,0x10,local_838);
        bVar4 = wwEq(&local_998,(word *)&local_918,8);
        if (bVar4 == 0) {
          return 0;
        }
        bVar4 = wwIsZero(&local_998,8);
        if (bVar4 == 0) {
          zzSubW2(pwVar1,0x10,2);
          zzSqrt((word *)&local_918,pwVar1,0x10,local_838);
          bVar4 = wwEq(&local_998,(word *)&local_918,8);
          if (bVar4 != 0) {
            return 0;
          }
          bVar4 = zzIsSumWEq(&local_998,(word *)&local_918,8,1);
          if (bVar4 == 0) {
            return 0;
          }
        }
        lVar21 = lVar21 + 1;
        if (lVar21 == 0) {
          return 1;
        }
      } while( true );
    }
    prngCOMBOStepR(&local_b38,0x40,awStack_b08 + 2);
    pwVar1 = awStack_a70 + 1;
    prngCOMBOStepR(pwVar1,0x80,awStack_b08 + 2);
    awStack_b08[1] = awStack_b08[1] + (awStack_b08[1] == 0);
    wwCopy(&local_998,pwVar1,0x10);
    zzRed(&local_998,&local_b38,8,local_838);
    zzRedBarrStart(awStack_b08 + 10,&local_b38,8,local_838);
    wwCopy((word *)&local_918,pwVar1,0x10);
    zzRedBarr((word *)&local_918,&local_b38,8,awStack_b08 + 10,local_838);
    bVar4 = wwEq((word *)&local_918,&local_998,8);
    if (bVar4 == 0) {
      return 0;
    }
    wwCopy((word *)&local_918,awStack_a70 + 1,0x10);
    zzRedBarr_fast((word *)&local_918,&local_b38,8,awStack_b08 + 10,local_838);
    bVar4 = wwEq((word *)&local_918,&local_998,8);
    if (bVar4 == 0) {
      return 0;
    }
    local_b38 = local_b38 | 1;
    wwCopy(&local_998,awStack_a70 + 1,0x10);
    zzRed(&local_998,&local_b38,8,local_838);
    wwCopy((word *)&local_918,awStack_a70 + 1,0x10);
    uVar19 = u64NegInv(local_b38);
    zzRedMont((word *)&local_918,&local_b38,8,uVar19,local_838);
    wwCopy(local_8d8,(word *)&local_918,8);
    wwSetZero((word *)&local_918,8);
    zzRed((word *)&local_918,&local_b38,8,local_838);
    bVar4 = wwEq((word *)&local_918,&local_998,8);
    if (bVar4 == 0) {
      return 0;
    }
    wwCopy((word *)&local_918,awStack_a70 + 1,0x10);
    uVar19 = u64NegInv(local_b38);
    zzRedMont_fast((word *)&local_918,&local_b38,8,uVar19,local_838);
    wwCopy(local_8d8,(word *)&local_918,8);
    wwSetZero((word *)&local_918,8);
    zzRed((word *)&local_918,&local_b38,8,local_838);
    bVar4 = wwEq((word *)&local_918,&local_998,8);
    if (bVar4 == 0) {
      return 0;
    }
    wwRepW(&local_b30,7,0xffffffffffffffff);
    wwCopy(&local_998,awStack_a70 + 1,0x10);
    zzRed(&local_998,&local_b38,8,local_838);
    wwCopy((word *)&local_918,awStack_a70 + 1,0x10);
    zzRedCrand((word *)&local_918,&local_b38,8,local_838);
    bVar4 = wwEq((word *)&local_918,&local_998,8);
    if (bVar4 == 0) {
      return 0;
    }
    wwCopy((word *)&local_918,awStack_a70 + 1,0x10);
    zzRedCrand_fast((word *)&local_918,&local_b38,8,local_838);
    bVar4 = wwEq((word *)&local_918,&local_998,8);
    if (bVar4 == 0) break;
    wwCopy(&local_998,awStack_a70 + 1,0x10);
    wwCopy((word *)&local_918,awStack_a70 + 1,0x10);
    uVar19 = u64NegInv(local_b38);
    zzRedMont(&local_998,&local_b38,8,uVar19,local_838);
    uVar19 = u64NegInv(local_b38);
    zzRedCrandMont((word *)&local_918,&local_b38,8,uVar19,local_838);
    bVar4 = wwEq((word *)&local_918,&local_998,8);
    if (bVar4 == 0) {
      return 0;
    }
    wwCopy(&local_998,awStack_a70 + 1,0x10);
    wwCopy((word *)&local_918,awStack_a70 + 1,0x10);
    uVar19 = u64NegInv(local_b38);
    zzRedMont_fast(&local_998,&local_b38,8,uVar19,local_838);
    uVar19 = u64NegInv(local_b38);
    zzRedCrandMont_fast((word *)&local_918,&local_b38,8,uVar19,local_838);
    bVar4 = wwEq_fast((word *)&local_918,&local_998,8);
    if (bVar4 == 0) {
      return 0;
    }
  }
  return 0;
}

Assistant:

bool_t zzTest()
{
	return zzTestAdd() && 
		zzTestMul() && 
		zzTestMod() && 
		zzTestGCD() && 
		zzTestRed() &&
		zzTestEtc();
}